

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

void InitVector(Vector *V,int sz)

{
  ostream *poVar1;
  
  if (0 < sz) {
    V->ArraySize = sz;
    V->VectorLength = 0;
    GetArray(V);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Invalid Array Size!");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void InitVector(Vector *V,int sz)  //初始化空向量，建立一个最大长度为sz的数组
{
    if(sz <= 0)
        cout << "Invalid Array Size!" << endl;
    else
    {
        V->ArraySize = sz;
        V->VectorLength = 0;
        GetArray(V);
    }
}